

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O3

Split * __thiscall
embree::avx::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::avx::GridRecalculatePrimRef,_2UL>::
TemporalBinInfo::best
          (Split *__return_storage_ptr__,TemporalBinInfo *this,int logBlockSize,BBox1f time_range,
          SetMB *set)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  undefined1 in_register_00001208 [56];
  undefined1 auVar10 [64];
  float fVar11;
  float fVar12;
  float center_time;
  undefined1 auVar13 [16];
  float fVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  auVar10._8_56_ = in_register_00001208;
  auVar10._0_8_ = time_range;
  bVar5 = (byte)logBlockSize;
  auVar13 = vmovshdup_avx(auVar10._0_16_);
  fVar11 = auVar13._0_4_;
  fVar8 = time_range.lower;
  fVar1 = (set->super_PrimInfoMB).max_time_range.lower;
  fVar9 = (set->super_PrimInfoMB).max_time_range.upper - fVar1;
  fVar14 = (float)(set->super_PrimInfoMB).max_num_time_segments;
  fVar12 = (((fVar8 * 0.5 + fVar11 * 0.5) - fVar1) / fVar9) * fVar14;
  auVar13._8_4_ = 0x80000000;
  auVar13._0_8_ = 0x8000000080000000;
  auVar13._12_4_ = 0x80000000;
  auVar13 = vandps_avx(ZEXT416((uint)fVar12),auVar13);
  auVar17._8_4_ = 0x3effffff;
  auVar17._0_8_ = 0x3effffff3effffff;
  auVar17._12_4_ = 0x3effffff;
  auVar13 = vorps_avx(auVar17,auVar13);
  auVar13 = ZEXT416((uint)(fVar12 + auVar13._0_4_));
  auVar13 = vroundss_avx(auVar13,auVar13,0xb);
  fVar1 = (auVar13._0_4_ / fVar14) * fVar9 + fVar1;
  uVar7 = ~(-1L << (bVar5 & 0x3f));
  uVar6 = this->count1[0] + uVar7 >> (bVar5 & 0x3f);
  fVar12 = INFINITY;
  iVar15 = 0;
  if ((fVar8 < fVar1) && (fVar1 < fVar11)) {
    uVar7 = uVar7 + this->count0[0] >> (bVar5 & 0x3f);
    if (uVar7 == 0) {
      fVar9 = 0.0;
    }
    else {
      auVar2 = vsubps_avx((undefined1  [16])this->bounds0[0].bounds0.upper.field_0,
                          (undefined1  [16])this->bounds0[0].bounds0.lower.field_0);
      auVar16 = vsubps_avx((undefined1  [16])this->bounds0[0].bounds1.upper.field_0,
                           (undefined1  [16])this->bounds0[0].bounds1.lower.field_0);
      auVar17 = vshufpd_avx(auVar2,auVar2,1);
      auVar13 = vinsertps_avx(auVar16,auVar2,0x4c);
      auVar17 = vinsertps_avx(auVar17,auVar16,0x9c);
      auVar2 = vinsertps_avx(auVar2,auVar16,0x1c);
      auVar16._0_4_ = (auVar13._0_4_ + auVar17._0_4_) * auVar2._0_4_ + auVar13._0_4_ * auVar17._0_4_
      ;
      auVar16._4_4_ = (auVar13._4_4_ + auVar17._4_4_) * auVar2._4_4_ + auVar13._4_4_ * auVar17._4_4_
      ;
      auVar16._8_4_ = (auVar13._8_4_ + auVar17._8_4_) * auVar2._8_4_ + auVar13._8_4_ * auVar17._8_4_
      ;
      auVar16._12_4_ =
           (auVar13._12_4_ + auVar17._12_4_) * auVar2._12_4_ + auVar13._12_4_ * auVar17._12_4_;
      auVar13 = vhaddps_avx(auVar16,auVar16);
      fVar9 = (fVar1 - fVar8) * auVar13._0_4_ * 0.5 * (float)uVar7;
    }
    if (uVar6 == 0) {
      fVar12 = 0.0;
    }
    else {
      auVar3 = vsubps_avx((undefined1  [16])this->bounds1[0].bounds0.upper.field_0,
                          (undefined1  [16])this->bounds1[0].bounds0.lower.field_0);
      auVar4 = vsubps_avx((undefined1  [16])this->bounds1[0].bounds1.upper.field_0,
                          (undefined1  [16])this->bounds1[0].bounds1.lower.field_0);
      auVar13 = vmovshdup_avx(auVar3);
      auVar2 = vshufpd_avx(auVar3,auVar3,1);
      auVar17 = vmovshdup_avx(auVar4);
      auVar16 = vshufpd_avx(auVar4,auVar4,1);
      fVar12 = (fVar11 - fVar1) *
               ((auVar2._0_4_ + auVar13._0_4_) * auVar3._0_4_ + auVar2._0_4_ * auVar13._0_4_ +
               (auVar17._0_4_ + auVar16._0_4_) * auVar4._0_4_ + auVar17._0_4_ * auVar16._0_4_) * 0.5
               * (float)uVar6;
    }
    fVar9 = fVar9 + fVar12;
    fVar12 = INFINITY;
    auVar13 = vcmpss_avx(ZEXT416((uint)fVar9),SUB6416(ZEXT464(0x7f800000),0),0xc);
    auVar13 = vandps_avx(auVar13,ZEXT416((uint)fVar1));
    iVar15 = auVar13._0_4_;
    if (fVar9 != INFINITY) {
      fVar12 = fVar9 * 1.25;
    }
  }
  __return_storage_ptr__->sah = fVar12;
  __return_storage_ptr__->dim = 0;
  (__return_storage_ptr__->field_2).pos = iVar15;
  __return_storage_ptr__->data = 2;
  return __return_storage_ptr__;
}

Assistant:

Split best(int logBlockSize, BBox1f time_range, const SetMB& set)
          {
            float bestSAH = inf;
            float bestPos = 0.0f;
            for (int b=0; b<BINS-1; b++)
            {
              float t = float(b+1)/float(BINS);
              float ct = lerp(time_range.lower,time_range.upper,t);
              const float center_time = set.align_time(ct);
              if (center_time <= time_range.lower) continue;
              if (center_time >= time_range.upper) continue;
              const BBox1f dt0(time_range.lower,center_time);
              const BBox1f dt1(center_time,time_range.upper);
              
              /* calculate sah */
              const size_t lCount = (count0[b]+(size_t(1) << logBlockSize)-1) >> int(logBlockSize);
              const size_t rCount = (count1[b]+(size_t(1) << logBlockSize)-1) >> int(logBlockSize);
              float sah0 = expectedApproxHalfArea(bounds0[b])*float(lCount)*dt0.size();
              float sah1 = expectedApproxHalfArea(bounds1[b])*float(rCount)*dt1.size();
              if (unlikely(lCount == 0)) sah0 = 0.0f; // happens for initial splits when objects not alive over entire shutter time
              if (unlikely(rCount == 0)) sah1 = 0.0f;
              const float sah = sah0+sah1;
              if (sah < bestSAH) {
                bestSAH = sah;
                bestPos = center_time;
              }
            }
            return Split(bestSAH*MBLUR_TIME_SPLIT_THRESHOLD,(unsigned)Split::SPLIT_TEMPORAL,0,bestPos);
          }